

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O1

_LHASH * OPENSSL_lh_new(lhash_hash_func hash,lhash_cmp_func comp)

{
  _LHASH *orig_ptr;
  LHASH_ITEM **ppLVar1;
  
  orig_ptr = (_LHASH *)OPENSSL_zalloc(0x30);
  if (orig_ptr != (_LHASH *)0x0) {
    orig_ptr->num_buckets = 0x10;
    ppLVar1 = (LHASH_ITEM **)OPENSSL_calloc(0x10,8);
    orig_ptr->buckets = ppLVar1;
    if (ppLVar1 != (LHASH_ITEM **)0x0) {
      orig_ptr->comp = comp;
      orig_ptr->hash = hash;
      return orig_ptr;
    }
    OPENSSL_free(orig_ptr);
  }
  return (_LHASH *)0x0;
}

Assistant:

_LHASH *OPENSSL_lh_new(lhash_hash_func hash, lhash_cmp_func comp) {
  _LHASH *ret = reinterpret_cast<_LHASH *>(OPENSSL_zalloc(sizeof(_LHASH)));
  if (ret == NULL) {
    return NULL;
  }

  ret->num_buckets = kMinNumBuckets;
  ret->buckets = reinterpret_cast<LHASH_ITEM **>(
      OPENSSL_calloc(ret->num_buckets, sizeof(LHASH_ITEM *)));
  if (ret->buckets == NULL) {
    OPENSSL_free(ret);
    return NULL;
  }

  ret->comp = comp;
  ret->hash = hash;
  return ret;
}